

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::WriteEvent(WatWriter *this,Event *event)

{
  string_view local_28;
  Event *local_18;
  Event *event_local;
  WatWriter *this_local;
  
  local_18 = event;
  event_local = (Event *)this;
  WriteOpenSpace(this,"event");
  string_view::string_view(&local_28,&local_18->name);
  WriteNameOrIndex(this,local_28,this->event_index_,Space);
  WriteInlineExports(this,Event,this->event_index_);
  WriteInlineImport(this,Event,this->event_index_);
  if (((local_18->decl).has_func_type & 1U) != 0) {
    WriteOpenSpace(this,"type");
    WriteVar(this,&(local_18->decl).type_var,None);
    WriteCloseSpace(this);
  }
  WriteTypes(this,&(local_18->decl).sig.param_types,"param");
  this->event_index_ = this->event_index_ + 1;
  WriteCloseNewline(this);
  return;
}

Assistant:

void WatWriter::WriteEvent(const Event& event) {
  WriteOpenSpace("event");
  WriteNameOrIndex(event.name, event_index_, NextChar::Space);
  WriteInlineExports(ExternalKind::Event, event_index_);
  WriteInlineImport(ExternalKind::Event, event_index_);
  if (event.decl.has_func_type) {
    WriteOpenSpace("type");
    WriteVar(event.decl.type_var, NextChar::None);
    WriteCloseSpace();
  }
  WriteTypes(event.decl.sig.param_types, "param");
  ++event_index_;
  WriteCloseNewline();
}